

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_io.c
# Opt level: O0

int csp_transaction_w_opts
              (uint8_t prio,uint16_t dest,uint8_t port,uint32_t timeout,void *outbuf,int outlen,
              void *inbuf,int inlen,uint32_t opts)

{
  csp_conn_t *inbuf_00;
  undefined1 in_DL;
  undefined2 in_SI;
  undefined1 in_DIL;
  void *in_R8;
  uint32_t in_R9D;
  int status;
  csp_conn_t *conn;
  int in_stack_ffffffffffffffd4;
  uint32_t in_stack_ffffffffffffffe0;
  undefined3 in_stack_fffffffffffffff4;
  uint32_t timeout_00;
  undefined1 in_stack_fffffffffffffffa;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  timeout_00 = CONCAT13(in_DL,in_stack_fffffffffffffff4);
  inbuf_00 = csp_connect((uint8_t)((ulong)in_R8 >> 0x38),(uint16_t)((ulong)in_R8 >> 0x20),
                         (uint8_t)((ulong)in_R8 >> 0x18),in_R9D,in_stack_ffffffffffffffe0);
  if (inbuf_00 == (csp_conn_t *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = csp_transaction_persistent
                      ((csp_conn_t *)
                       CONCAT44(in_stack_fffffffffffffffc,
                                CONCAT13(in_DIL,CONCAT12(in_stack_fffffffffffffffa,in_SI))),
                       timeout_00,in_R8,in_R9D,inbuf_00,in_stack_ffffffffffffffd4);
    csp_close((csp_conn_t *)0x109e5f);
  }
  return iVar1;
}

Assistant:

int csp_transaction_w_opts(uint8_t prio, uint16_t dest, uint8_t port, uint32_t timeout, const void * outbuf, int outlen, void * inbuf, int inlen, uint32_t opts) {

	csp_conn_t * conn = csp_connect(prio, dest, port, 0, opts);
	if (conn == NULL)
		return 0;

	int status = csp_transaction_persistent(conn, timeout, outbuf, outlen, inbuf, inlen);

	csp_close(conn);

	return status;
}